

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL Js::VariableWalkerBase::GetReturnedValue
               (int *index,DiagStackFrame *frame,ResolvedObject *pResolvedObject)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  DebugContext *pDVar6;
  ReturnedValueList *this;
  Type *pTVar7;
  BOOL BVar8;
  BOOL BVar9;
  
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x11f,"(pResolvedObject)","pResolvedObject");
    if (!bVar3) goto LAB_008bcba9;
    *puVar5 = 0;
  }
  if (pResolvedObject->scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x120,"(pResolvedObject->scriptContext)",
                                "pResolvedObject->scriptContext");
    if (!bVar3) goto LAB_008bcba9;
    *puVar5 = 0;
  }
  if (frame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x121,"(frame)","frame");
    if (!bVar3) goto LAB_008bcba9;
    *puVar5 = 0;
  }
  if (*index < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x122,"(index >= 0)","index >= 0");
    if (!bVar3) {
LAB_008bcba9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  iVar4 = (*frame->_vptr_DiagStackFrame[10])(frame);
  pDVar6 = ScriptContext::GetDebugContext((ScriptContext *)CONCAT44(extraout_var,iVar4));
  this = ProbeContainer::GetReturnedValueList(pDVar6->diagProbesContainer);
  BVar8 = 0;
  BVar9 = 0;
  if ((this != (ReturnedValueList *)0x0) &&
     (BVar9 = BVar8,
     0 < (this->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count))
  {
    bVar3 = DiagStackFrame::IsTopFrame(frame);
    if (bVar3) {
      iVar4 = *index;
      iVar1 = (this->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
              count;
      if (iVar4 < iVar1) {
        pTVar7 = JsUtil::
                 List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this,iVar4);
        GetReturnedValueResolvedObject(pTVar7->ptr,frame,pResolvedObject);
        BVar9 = 1;
      }
      else {
        *index = iVar4 - iVar1;
      }
    }
  }
  return BVar9;
}

Assistant:

BOOL VariableWalkerBase::GetReturnedValue(int &index, DiagStackFrame* frame, ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);
        Assert(pResolvedObject->scriptContext);
        Assert(frame);
        Assert(index >= 0);
        ReturnedValueList *returnedValueList = frame->GetScriptContext()->GetDebugContext()->GetProbeContainer()->GetReturnedValueList();

        if (returnedValueList != nullptr && returnedValueList->Count() > 0 && frame->IsTopFrame())
        {
            if (index < returnedValueList->Count())
            {
                ReturnedValue * returnValue = returnedValueList->Item(index);
                VariableWalkerBase::GetReturnedValueResolvedObject(returnValue, frame, pResolvedObject);
                return TRUE;
            }

            // Adjust the index
            index -= returnedValueList->Count();
        }

        return FALSE;
    }